

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-store.c
# Opt level: O2

_Bool borg_think_store(void)

{
  _Bool _Var1;
  char *what;
  
  if ((ushort)(borg_t + 0xb1e0U) < 0xb) {
    borg_keypress(0xe000);
    borg_keypress(0xe000);
    borg_keypress(0xe000);
    borg_keypress(0xe000);
  }
  borg_do_inven = true;
  borg_do_equip = true;
  borg_notice(true);
  _Var1 = borg_best_stuff();
  if (_Var1) {
    return true;
  }
  if (((borg_items[z_info->pack_size].tval == '\x06') &&
      (borg_items[z_info->pack_size].art_idx == '\0')) && (_Var1 = borg_wear_stuff(), _Var1)) {
    return true;
  }
  _Var1 = borg_choose_shop();
  if (_Var1) {
    if (shop_num == borg.goal.shop) {
      what = format("# Currently in preferred store \'%d\'.",(ulong)((int)borg.goal.shop + 1));
    }
    else {
      what = format("# Currently in store \'%d\' would prefer \'%d\'.",(ulong)((int)shop_num + 1),
                    (ulong)((int)borg.goal.shop + 1));
    }
    borg_note(what);
    _Var1 = borg_think_shop_sell();
    if (_Var1) {
      return true;
    }
    _Var1 = borg_think_shop_buy();
    if (_Var1) {
      return true;
    }
  }
  borg.goal.item = -1;
  borg.goal.shop = -1;
  borg.goal.ware = -1;
  borg_keypress(0xe000);
  borg_keypress(0xe000);
  borg_keypress(0xe000);
  borg_keypress(0xe000);
  return true;
}

Assistant:

bool borg_think_store(void)
{
    /* Hack -- prevent clock wrapping */
    if (borg_t >= 20000 && borg_t <= 20010) {
        /* Clear Possible errors */
        borg_keypress(ESCAPE);
        borg_keypress(ESCAPE);
        borg_keypress(ESCAPE);
        borg_keypress(ESCAPE);

        /* Re-examine inven and equip */
        borg_do_inven = true;
        borg_do_equip = true;
    }

    /* update all my equipment and swap items */
    borg_do_inven = true;
    borg_do_equip = true;
    borg_notice(true);

#if 0
    /* Stamp the shop with a time stamp */
    borg_shops[shop_num].when = borg_t;
#endif

    /* Wear "optimal" equipment */
    if (borg_best_stuff())
        return true;

    /* If using a digger, Wear "useful" equipment.
     * unless that digger is an artifact, then treat
     * it as a normal weapon
     */
    if (borg_items[INVEN_WIELD].tval == TV_DIGGING
        && !borg_items[INVEN_WIELD].art_idx && borg_wear_stuff())
        return true;

    /* Choose a shop to visit.  Goal_shop indicates he is trying to sell
     * something somewhere. */
    if (borg_choose_shop()) {
        /* Note Pref. */
        if (shop_num != borg.goal.shop)
            borg_note(format("# Currently in store '%d' would prefer '%d'.",
                shop_num + 1, borg.goal.shop + 1));
        else
            borg_note(format(
                "# Currently in preferred store '%d'.", borg.goal.shop + 1));

        /* Try to sell stuff */
        if (borg_think_shop_sell())
            return true;

        /* Try to buy stuff */
        if (borg_think_shop_buy())
            return true;
    }

    /* No shop */
    borg.goal.shop = borg.goal.ware = borg.goal.item = -1;

    /* Leave the store */
    borg_keypress(ESCAPE);
    borg_keypress(ESCAPE);
    borg_keypress(ESCAPE);
    borg_keypress(ESCAPE);

    /* Done */
    return true;
}